

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BendTypesSectionParser.cpp
# Opt level: O2

void __thiscall
OpenMD::BendTypesSectionParser::parseLine
          (BendTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  int iVar1;
  BendType *bendType;
  BendTypeParser btParser;
  string at1;
  string remainder;
  string at3;
  string at2;
  StringTokenizer tokenizer;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>_>_>
  _Stack_128;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  StringTokenizer local_78;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&_Stack_128," ;\t\n\r",(allocator<char> *)&local_f8);
  StringTokenizer::StringTokenizer(&local_78,line,(string *)&_Stack_128);
  std::__cxx11::string::~string((string *)&_Stack_128);
  BendTypeParser::BendTypeParser((BendTypeParser *)&_Stack_128);
  iVar1 = StringTokenizer::countTokens(&local_78);
  if (iVar1 < 5) {
    snprintf(painCave.errMsg,2000,"BendTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(&local_f8,&local_78);
    StringTokenizer::nextToken_abi_cxx11_(&local_98,&local_78);
    StringTokenizer::nextToken_abi_cxx11_(&local_b8,&local_78);
    StringTokenizer::getRemainingString_abi_cxx11_(&local_d8,&local_78);
    bendType = BendTypeParser::parseLine
                         ((BendTypeParser *)&_Stack_128,&local_d8,
                          (this->options_->BendForceConstantScaling).data_);
    if (bendType != (BendType *)0x0) {
      ForceField::addBendType(ff,&local_f8,&local_98,&local_b8,bendType);
    }
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BendTypeParser::BendTypeEnum>_>_>
  ::~_Rb_tree(&_Stack_128);
  StringTokenizer::~StringTokenizer(&local_78);
  return;
}

Assistant:

void BendTypesSectionParser::parseLine(ForceField& ff,
                                         const std::string& line, int lineNo) {
    StringTokenizer tokenizer(line);
    BendTypeParser btParser;
    BendType* bendType = NULL;

    int nTokens = tokenizer.countTokens();

    if (nTokens < 5) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "BendTypesSectionParser Error: Not enough tokens at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
      return;
    }

    std::string at1       = tokenizer.nextToken();
    std::string at2       = tokenizer.nextToken();
    std::string at3       = tokenizer.nextToken();
    std::string remainder = tokenizer.getRemainingString();
    RealType kScale       = options_.getBendForceConstantScaling();

    try {
      bendType = btParser.parseLine(remainder, kScale);
    } catch (OpenMDException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "BendTypesSectionParser Error: %s "
               "at line %d\n",
               e.what(), lineNo);
      painCave.isFatal = 1;
      simError();
    }

    if (bendType != NULL) { ff.addBendType(at1, at2, at3, bendType); }
  }